

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O3

wchar_t older(stat_conflict *st,archive_entry *entry)

{
  long lVar1;
  time_t tVar2;
  time_t tVar3;
  long lVar4;
  
  lVar1 = (st->st_mtim).tv_sec;
  tVar2 = archive_entry_mtime(entry);
  tVar3 = archive_entry_mtime(entry);
  if (-1 < tVar2) {
    if (tVar3 < 0) {
      tVar3 = 0x7fffffffffffffff;
    }
    else {
      tVar3 = archive_entry_mtime(entry);
    }
  }
  if (lVar1 < tVar3) {
    return L'\x01';
  }
  lVar1 = (st->st_mtim).tv_sec;
  tVar2 = archive_entry_mtime(entry);
  tVar3 = archive_entry_mtime(entry);
  if (-1 < tVar2) {
    if (tVar3 < 0) goto LAB_003c031d;
    tVar3 = archive_entry_mtime(entry);
  }
  if (tVar3 < lVar1) {
    return L'\0';
  }
LAB_003c031d:
  lVar1 = (st->st_mtim).tv_nsec;
  lVar4 = archive_entry_mtime_nsec(entry);
  return (uint)(lVar1 < lVar4);
}

Assistant:

static int
older(struct stat *st, struct archive_entry *entry)
{
	/* First, test the seconds and return if we have a definite answer. */
	/* Definitely older. */
	if (to_int64_time(st->st_mtime) < to_int64_time(archive_entry_mtime(entry)))
		return (1);
	/* Definitely younger. */
	if (to_int64_time(st->st_mtime) > to_int64_time(archive_entry_mtime(entry)))
		return (0);
	/* If this platform supports fractional seconds, try those. */
#if HAVE_STRUCT_STAT_ST_MTIMESPEC_TV_NSEC
	/* Definitely older. */
	if (st->st_mtimespec.tv_nsec < archive_entry_mtime_nsec(entry))
		return (1);
#elif HAVE_STRUCT_STAT_ST_MTIM_TV_NSEC
	/* Definitely older. */
	if (st->st_mtim.tv_nsec < archive_entry_mtime_nsec(entry))
		return (1);
#elif HAVE_STRUCT_STAT_ST_MTIME_N
	/* older. */
	if (st->st_mtime_n < archive_entry_mtime_nsec(entry))
		return (1);
#elif HAVE_STRUCT_STAT_ST_UMTIME
	/* older. */
	if (st->st_umtime * 1000 < archive_entry_mtime_nsec(entry))
		return (1);
#elif HAVE_STRUCT_STAT_ST_MTIME_USEC
	/* older. */
	if (st->st_mtime_usec * 1000 < archive_entry_mtime_nsec(entry))
		return (1);
#else
	/* This system doesn't have high-res timestamps. */
#endif
	/* Same age or newer, so not older. */
	return (0);
}